

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

int splittingStep_Init(ARKodeMem ark_mem,sunrealtype tout,int init_type)

{
  int iVar1;
  int in_ESI;
  ARKodeMem in_RDI;
  int i;
  int retval;
  ARKodeSplittingStepMem step_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_30;
  int local_4;
  
  local_4 = splittingStep_AccessStepMem
                      ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (ARKodeSplittingStepMem *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (local_4 == 0) {
    if (in_RDI->interp_type == 0) {
      for (local_30 = 0; local_30 < iRam0000000000000018; local_30 = local_30 + 1) {
        if (*(long *)(*(long *)(*(long *)(lRam0000000000000000 + (long)local_30 * 8) + 8) + 0x10) ==
            0) {
          arkProcessError(in_RDI,-0x16,0x82,"splittingStep_Init",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                          ,
                          "steppers[%d] must implement SUNStepper_FullRhs when using Hermite interpolation"
                          ,local_30);
          return -0x16;
        }
      }
    }
    if ((in_ESI == 2) || (in_ESI == 1)) {
      local_4 = 0;
    }
    else if (in_RDI->fixedstep == 0) {
      arkProcessError(in_RDI,-0x16,0x93,"splittingStep_Init",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                      ,"Adaptive outer time stepping is not currently supported");
      local_4 = -0x16;
    }
    else {
      local_4 = splittingStep_SetCoefficients
                          ((ARKodeMem)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                           (ARKodeSplittingStepMem)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (local_4 == 0) {
        if (*(int *)(lRam0000000000000008 + 0x1c) + -1 < in_RDI->interp_degree) {
          iVar1 = *(int *)(lRam0000000000000008 + 0x1c) + -1;
        }
        else {
          iVar1 = in_RDI->interp_degree;
        }
        if (iVar1 < 1) {
          iVar1 = 1;
        }
        else if (*(int *)(lRam0000000000000008 + 0x1c) + -1 < in_RDI->interp_degree) {
          iVar1 = *(int *)(lRam0000000000000008 + 0x1c) + -1;
        }
        else {
          iVar1 = in_RDI->interp_degree;
        }
        in_RDI->interp_degree = iVar1;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int splittingStep_Init(ARKodeMem ark_mem,
                              SUNDIALS_MAYBE_UNUSED sunrealtype tout,
                              int init_type)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (ark_mem->interp_type == ARK_INTERP_HERMITE)
  {
    for (int i = 0; i < step_mem->partitions; i++)
    {
      if (step_mem->steppers[i]->ops->fullrhs == NULL)
      {
        arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                        __FILE__, "steppers[%d] must implement SUNStepper_FullRhs when using Hermite interpolation",
                        i);
        return ARK_ILL_INPUT;
      }
    }
  }

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
  {
    return ARK_SUCCESS;
  }

  /* assume fixed step size */
  if (!ark_mem->fixedstep)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Adaptive outer time stepping is not currently supported");
    return ARK_ILL_INPUT;
  }

  retval = splittingStep_SetCoefficients(ark_mem, step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  ark_mem->interp_degree =
    SUNMAX(1, SUNMIN(step_mem->coefficients->order - 1, ark_mem->interp_degree));

  return ARK_SUCCESS;
}